

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.h
# Opt level: O0

example * __thiscall
VW::object_pool<example,_example_initializer>::get_object
          (object_pool<example,_example_initializer> *this)

{
  bool bVar1;
  reference ppeVar2;
  value_type obj;
  unique_lock<std::mutex> lock;
  size_t in_stack_00000058;
  object_pool<example,_example_initializer> *in_stack_00000060;
  mutex_type *in_stack_ffffffffffffffa8;
  unique_lock<std::mutex> *in_stack_ffffffffffffffb0;
  value_type this_00;
  
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  bVar1 = std::queue<example_*,_std::deque<example_*,_std::allocator<example_*>_>_>::empty
                    ((queue<example_*,_std::deque<example_*,_std::allocator<example_*>_>_> *)
                     0x2a4c9b);
  if (bVar1) {
    new_chunk(in_stack_00000060,in_stack_00000058);
  }
  ppeVar2 = std::queue<example_*,_std::deque<example_*,_std::allocator<example_*>_>_>::front
                      ((queue<example_*,_std::deque<example_*,_std::allocator<example_*>_>_> *)
                       0x2a4ce8);
  this_00 = *ppeVar2;
  std::queue<example_*,_std::deque<example_*,_std::allocator<example_*>_>_>::pop
            ((queue<example_*,_std::deque<example_*,_std::allocator<example_*>_>_> *)0x2a4d0a);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)this_00);
  return this_00;
}

Assistant:

T* get_object()
  {
    std::unique_lock<std::mutex> lock(m_lock);
    if (m_pool.empty())
    {
      new_chunk(m_chunk_size);
    }

    auto obj = m_pool.front();
    m_pool.pop();
    return obj;
  }